

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_prim_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PrimMeta *meta,uint32_t indent)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  type *ptVar5;
  type *ptVar6;
  reference pvVar7;
  value_type *this_00;
  value_type *this_01;
  value_type *m;
  value_type *pvVar8;
  type *ptVar9;
  value_type *pvVar10;
  size_type sVar11;
  reference pvVar12;
  type *ptVar13;
  type *ptVar14;
  ulong uVar15;
  value_type *pvVar16;
  value_type *pvVar17;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  ostream *poVar18;
  Dictionary *this_03;
  bool v;
  bool v_00;
  bool v_01;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  ListEditQual v_02;
  uint32_t n_06;
  ListEditQual v_03;
  uint32_t n_07;
  ListEditQual v_04;
  uint32_t n_08;
  ListEditQual v_05;
  uint32_t n_09;
  uint32_t n_10;
  uint32_t n_11;
  APIName *name_00;
  StringData *v_06;
  StringData *v_07;
  string local_820;
  reference local_800;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>
  *item_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  Dictionary *__range1_1;
  reference local_7c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8 [8];
  type instanceName;
  type local_694;
  ulong uStack_690;
  type name;
  size_t i;
  string local_668;
  undefined1 local_648 [8];
  value_type schemas;
  string local_608;
  tinyusdz *local_5e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vs;
  undefined1 local_5d8 [4];
  type listEditQual_2;
  string local_5b8;
  allocator local_591;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  undefined1 local_4f0 [8];
  type var_1;
  undefined1 local_4d0 [4];
  type listEditQual_1;
  string local_4b0;
  undefined1 local_490 [8];
  type var;
  undefined1 local_470 [4];
  type listEditQual;
  allocator local_449;
  string local_448;
  string local_428;
  allocator local_401;
  string local_400;
  string local_3e0;
  string local_3c0;
  allocator local_399;
  string local_398;
  string local_378;
  string local_358;
  allocator local_331;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  allocator local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  PrimMetas *pPStack_18;
  uint32_t indent_local;
  PrimMeta *meta_local;
  
  local_1c = (uint)meta;
  pPStack_18 = (PrimMetas *)this;
  meta_local = (PrimMeta *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)pPStack_18);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_1c8);
    poVar18 = std::operator<<(poVar18,"active = ");
    pvVar2 = nonstd::optional_lite::optional<bool>::value(&pPStack_18->active);
    to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)(*pvVar2 & 1),v);
    poVar18 = std::operator<<(poVar18,(string *)&local_1e8);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->clips);
  if (bVar1) {
    pvVar17 = nonstd::optional_lite::
              optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
              ::value(&pPStack_18->clips);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_228,"clips",&local_229);
    indent = local_1c;
    print_customData(&local_208,pvVar17,&local_228,local_1c);
    std::operator<<(aoStack_198,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->instanceable);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_1c,n_00);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_250);
    poVar18 = std::operator<<(poVar18,"instanceable = ");
    pvVar2 = nonstd::optional_lite::optional<bool>::value(&pPStack_18->instanceable);
    to_string_abi_cxx11_(&local_270,(tinyusdz *)(ulong)(*pvVar2 & 1),v_00);
    poVar18 = std::operator<<(poVar18,(string *)&local_270);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->hidden);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_290,(pprint *)(ulong)local_1c,n_01);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_290);
    poVar18 = std::operator<<(poVar18,"hidden = ");
    pvVar2 = nonstd::optional_lite::optional<bool>::value(&pPStack_18->hidden);
    to_string_abi_cxx11_(&local_2b0,(tinyusdz *)(ulong)(*pvVar2 & 1),v_01);
    poVar18 = std::operator<<(poVar18,(string *)&local_2b0);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->kind);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_2d0,(pprint *)(ulong)local_1c,n_02);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_2d0);
    poVar18 = std::operator<<(poVar18,"kind = ");
    PrimMetas::get_kind_abi_cxx11_(&local_310,pPStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_330,"\"",&local_331);
    quote(&local_2f0,&local_310,&local_330);
    poVar18 = std::operator<<(poVar18,(string *)&local_2f0);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->sceneName)
  ;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_358,(pprint *)(ulong)local_1c,n_03);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_358);
    poVar18 = std::operator<<(poVar18,"sceneName = ");
    pvVar3 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&pPStack_18->sceneName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_398,"\"",&local_399);
    quote(&local_378,pvVar3,&local_398);
    poVar18 = std::operator<<(poVar18,(string *)&local_378);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    std::__cxx11::string::~string((string *)&local_358);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->displayName);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_3c0,(pprint *)(ulong)local_1c,n_04);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_3c0);
    poVar18 = std::operator<<(poVar18,"displayName = ");
    pvVar3 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&pPStack_18->displayName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_400,"\"",&local_401);
    quote(&local_3e0,pvVar3,&local_400);
    poVar18 = std::operator<<(poVar18,(string *)&local_3e0);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->assetInfo)
  ;
  if (bVar1) {
    pvVar17 = nonstd::optional_lite::
              optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
              ::value(&pPStack_18->assetInfo);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_448,"assetInfo",&local_449);
    indent = local_1c;
    print_customData(&local_428,pvVar17,&local_448,local_1c);
    std::operator<<(aoStack_198,(string *)&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->inherits);
  if (bVar1) {
    pprint::Indent_abi_cxx11_((string *)local_470,(pprint *)(ulong)local_1c,n_05);
    std::operator<<(aoStack_198,(string *)local_470);
    std::__cxx11::string::~string((string *)local_470);
    pvVar4 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value(&pPStack_18->inherits);
    ptVar5 = std::
             get<0ul,tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>
                       (pvVar4);
    var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = *ptVar5;
    pvVar4 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value(&pPStack_18->inherits);
    ptVar6 = std::
             get<1ul,tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>
                       (pvVar4);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_490,ptVar6);
    if (var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != ResetToExplicit) {
      to_string_abi_cxx11_
                (&local_4b0,
                 (tinyusdz *)
                 (ulong)var.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,v_02);
      poVar18 = std::operator<<(aoStack_198,(string *)&local_4b0);
      std::operator<<(poVar18," ");
      std::__cxx11::string::~string((string *)&local_4b0);
    }
    sVar11 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                       ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_490);
    if (sVar11 == 1) {
      poVar18 = std::operator<<(aoStack_198,"inherits = ");
      pvVar7 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                         ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_490,0);
      std::operator<<(poVar18,pvVar7);
    }
    else {
      poVar18 = std::operator<<(aoStack_198,"inherits = ");
      std::operator<<(poVar18,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_490);
    }
    std::operator<<(aoStack_198,"\n");
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_490);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->specializes);
  if (bVar1) {
    pprint::Indent_abi_cxx11_((string *)local_4d0,(pprint *)(ulong)local_1c,n_06);
    std::operator<<(aoStack_198,(string *)local_4d0);
    std::__cxx11::string::~string((string *)local_4d0);
    pvVar4 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value(&pPStack_18->specializes);
    ptVar5 = std::
             get<0ul,tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>
                       (pvVar4);
    var_1.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = *ptVar5;
    pvVar4 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value(&pPStack_18->specializes);
    ptVar6 = std::
             get<1ul,tinyusdz::ListEditQual,std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>
                       (pvVar4);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4f0,ptVar6);
    if (var_1.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != ResetToExplicit) {
      to_string_abi_cxx11_
                (&local_510,
                 (tinyusdz *)
                 (ulong)var_1.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,v_03);
      poVar18 = std::operator<<(aoStack_198,(string *)&local_510);
      std::operator<<(poVar18," ");
      std::__cxx11::string::~string((string *)&local_510);
    }
    sVar11 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                       ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4f0);
    if (sVar11 == 1) {
      poVar18 = std::operator<<(aoStack_198,"specializes = ");
      pvVar7 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                         ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4f0,0);
      std::operator<<(poVar18,pvVar7);
    }
    else {
      poVar18 = std::operator<<(aoStack_198,"specializes = ");
      std::operator<<(poVar18,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4f0);
    }
    std::operator<<(aoStack_198,"\n");
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4f0);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->references);
  if (bVar1) {
    this_00 = nonstd::optional_lite::
              optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
              ::value(&pPStack_18->references);
    (anonymous_namespace)::print_references_abi_cxx11_
              (&local_530,(_anonymous_namespace_ *)this_00,(ReferenceList *)(ulong)local_1c,indent);
    std::operator<<(aoStack_198,(string *)&local_530);
    std::__cxx11::string::~string((string *)&local_530);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->payload);
  if (bVar1) {
    this_01 = nonstd::optional_lite::
              optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
              ::value(&pPStack_18->payload);
    print_payload_abi_cxx11_(&local_550,(tinyusdz *)this_01,(PayloadList *)(ulong)local_1c,indent);
    std::operator<<(aoStack_198,(string *)&local_550);
    std::__cxx11::string::~string((string *)&local_550);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->sdrMetadata);
  if (bVar1) {
    pvVar17 = nonstd::optional_lite::
              optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
              ::value(&pPStack_18->sdrMetadata);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_590,"sdrMetadata",&local_591);
    indent = local_1c;
    print_customData(&local_570,pvVar17,&local_590,local_1c);
    std::operator<<(aoStack_198,(string *)&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->variants);
  if (bVar1) {
    m = nonstd::optional_lite::
        optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::value(&pPStack_18->variants);
    print_variantSelectionMap(&local_5b8,m,local_1c);
    std::operator<<(aoStack_198,(string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->variantSets);
  if (bVar1) {
    pprint::Indent_abi_cxx11_((string *)local_5d8,(pprint *)(ulong)local_1c,n_07);
    std::operator<<(aoStack_198,(string *)local_5d8);
    std::__cxx11::string::~string((string *)local_5d8);
    pvVar8 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::value(&pPStack_18->variantSets);
    ptVar9 = std::
             get<0ul,tinyusdz::ListEditQual,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (pvVar8);
    vs._4_4_ = *ptVar9;
    pvVar8 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::value(&pPStack_18->variantSets);
    local_5e8 = (tinyusdz *)
                std::
                get<1ul,tinyusdz::ListEditQual,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pvVar8);
    if (vs._4_4_ != ResetToExplicit) {
      to_string_abi_cxx11_(&local_608,(tinyusdz *)(ulong)vs._4_4_,v_04);
      poVar18 = std::operator<<(aoStack_198,(string *)&local_608);
      std::operator<<(poVar18," ");
      std::__cxx11::string::~string((string *)&local_608);
    }
    std::operator<<(aoStack_198,"variantSets = ");
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5e8);
    if (bVar1) {
      std::operator<<(aoStack_198,"None");
    }
    else {
      to_string<std::__cxx11::string>
                ((string *)
                 &schemas.names.
                  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_5e8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,indent);
      std::operator<<(aoStack_198,
                      (string *)
                      &schemas.names.
                       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &schemas.names.
                  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::operator<<(aoStack_198,"\n");
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->apiSchemas);
  if (bVar1) {
    pvVar10 = nonstd::optional_lite::optional<tinyusdz::APISchemas>::value(&pPStack_18->apiSchemas);
    APISchemas::APISchemas((APISchemas *)local_648,pvVar10);
    sVar11 = std::
             vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::size((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&schemas);
    if (sVar11 != 0) {
      pprint::Indent_abi_cxx11_(&local_668,(pprint *)(ulong)local_1c,n_08);
      poVar18 = std::operator<<(aoStack_198,(string *)&local_668);
      to_string_abi_cxx11_((string *)&i,(tinyusdz *)(ulong)(uint)local_648._0_4_,v_05);
      poVar18 = std::operator<<(poVar18,(string *)&i);
      std::operator<<(poVar18," apiSchemas = [");
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)&local_668);
      for (uStack_690 = 0; uVar15 = uStack_690,
          sVar11 = std::
                   vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::size((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&schemas), uVar15 < sVar11; uStack_690 = uStack_690 + 1) {
        if (uStack_690 != 0) {
          std::operator<<(aoStack_198,", ");
        }
        pvVar12 = std::
                  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&schemas,uStack_690);
        ptVar13 = std::get<0ul,tinyusdz::APISchemas::APIName,std::__cxx11::string>(pvVar12);
        local_694 = *ptVar13;
        poVar18 = std::operator<<(aoStack_198,"\"");
        to_string_abi_cxx11_
                  ((string *)((long)&instanceName.field_2 + 8),(tinyusdz *)&local_694,name_00);
        std::operator<<(poVar18,(string *)(instanceName.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(instanceName.field_2._M_local_buf + 8));
        pvVar12 = std::
                  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&schemas,uStack_690);
        ptVar14 = std::get<1ul,tinyusdz::APISchemas::APIName,std::__cxx11::string>(pvVar12);
        std::__cxx11::string::string(local_6d8,(string *)ptVar14);
        uVar15 = std::__cxx11::string::empty();
        if ((uVar15 & 1) == 0) {
          poVar18 = std::operator<<(aoStack_198,":");
          std::operator<<(poVar18,local_6d8);
        }
        std::operator<<(aoStack_198,"\"");
        std::__cxx11::string::~string(local_6d8);
      }
      std::operator<<(aoStack_198,"]\n");
    }
    APISchemas::~APISchemas((APISchemas *)local_648);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->doc);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_6f8,(pprint *)(ulong)local_1c,n_09);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_6f8);
    poVar18 = std::operator<<(poVar18,"doc = ");
    pvVar16 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::value(&pPStack_18->doc);
    to_string_abi_cxx11_(&local_718,(tinyusdz *)pvVar16,v_06);
    poVar18 = std::operator<<(poVar18,(string *)&local_718);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_718);
    std::__cxx11::string::~string((string *)&local_6f8);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPStack_18->comment);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_738,(pprint *)(ulong)local_1c,n_10);
    poVar18 = std::operator<<(aoStack_198,(string *)&local_738);
    poVar18 = std::operator<<(poVar18,"comment = ");
    pvVar16 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::value
                        (&pPStack_18->comment);
    to_string_abi_cxx11_(&local_758,(tinyusdz *)pvVar16,v_07);
    poVar18 = std::operator<<(poVar18,(string *)&local_758);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string((string *)&local_738);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->customData);
  if (bVar1) {
    pvVar17 = nonstd::optional_lite::
              optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
              ::value(&pPStack_18->customData);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_798,"customData",(allocator *)((long)&__range1 + 7));
    print_customData(&local_778,pvVar17,&local_798,local_1c);
    std::operator<<(aoStack_198,(string *)&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  this_02 = &pPStack_18->unregisteredMetas;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_02);
  item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(this_02);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&item), bVar1) {
    local_7c0 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1);
    pprint::Indent_abi_cxx11_((string *)&__range1_1,(pprint *)(ulong)local_1c,n_11);
    poVar18 = std::operator<<(aoStack_198,(string *)&__range1_1);
    poVar18 = std::operator<<(poVar18,(string *)local_7c0);
    poVar18 = std::operator<<(poVar18," = ");
    poVar18 = std::operator<<(poVar18,(string *)&local_7c0->second);
    std::operator<<(poVar18,"\n");
    std::__cxx11::string::~string((string *)&__range1_1);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  this_03 = &pPStack_18->meta;
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
             ::begin(this_03);
  item_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::end(this_03);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&item_1), bVar1) {
    local_800 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
                ::operator*(&__end1_1);
    print_meta(&local_820,&local_800->second,local_1c + 1,true,&local_800->first);
    std::operator<<(aoStack_198,(string *)&local_820);
    std::__cxx11::string::~string((string *)&local_820);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_prim_metas(const PrimMeta &meta, const uint32_t indent) {
  std::stringstream ss;

  if (meta.active) {
    ss << pprint::Indent(indent)
       << "active = " << to_string(meta.active.value()) << "\n";
  }

  if (meta.clips) {
    ss << print_customData(meta.clips.value(), "clips", indent);
  }

  if (meta.instanceable) {
    ss << pprint::Indent(indent)
       << "instanceable = " << to_string(meta.instanceable.value()) << "\n";
  }

  if (meta.hidden) {
    ss << pprint::Indent(indent)
       << "hidden = " << to_string(meta.hidden.value()) << "\n";
  }

  if (meta.kind) {
    ss << pprint::Indent(indent) << "kind = " << quote(meta.get_kind()) << "\n";
  }

  // TODO: UTF-8 ready pprint
  if (meta.sceneName) {
    ss << pprint::Indent(indent)
       << "sceneName = " << quote(meta.sceneName.value()) << "\n";
  }

  // TODO: UTF-8 ready pprint
  if (meta.displayName) {
    ss << pprint::Indent(indent)
       << "displayName = " << quote(meta.displayName.value()) << "\n";
  }

  if (meta.assetInfo) {
    ss << print_customData(meta.assetInfo.value(), "assetInfo", indent);
  }

  if (meta.inherits) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.inherits.value());
    auto var = std::get<1>(meta.inherits.value());

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    if (var.size() == 1) {
      // print as scalar
      ss << "inherits = " << var[0];
    } else {
      ss << "inherits = " << var;
    }
    ss << "\n";
  }

  if (meta.specializes) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.specializes.value());
    auto var = std::get<1>(meta.specializes.value());

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    if (var.size() == 1) {
      // print as scalar
      ss << "specializes = " << var[0];
    } else {
      ss << "specializes = " << var;
    }
    ss << "\n";
  }

  if (meta.references) {
    ss << print_references(meta.references.value(), indent);
  }

  if (meta.payload) {
    ss << print_payload(meta.payload.value(), indent);
  }

  // TODO: only print in usdShade Prims.
  if (meta.sdrMetadata) {
    ss << print_customData(meta.sdrMetadata.value(), "sdrMetadata", indent);
  }

  if (meta.variants) {
    ss << print_variantSelectionMap(meta.variants.value(), indent);
  }

  if (meta.variantSets) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.variantSets.value());
    const std::vector<std::string> &vs =
        std::get<1>(meta.variantSets.value());  // string[]

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    ss << "variantSets = ";

    if (vs.empty()) {
      ss << "None";
    } else {
      ss << to_string(vs);
    }

    ss << "\n";
  }

  if (meta.apiSchemas) {
    auto schemas = meta.apiSchemas.value();

    if (schemas.names.size()) {
      ss << pprint::Indent(indent) << to_string(schemas.listOpQual)
         << " apiSchemas = [";

      for (size_t i = 0; i < schemas.names.size(); i++) {
        if (i != 0) {
          ss << ", ";
        }

        auto name = std::get<0>(schemas.names[i]);
        ss << "\"" << to_string(name);

        auto instanceName = std::get<1>(schemas.names[i]);

        if (!instanceName.empty()) {
          ss << ":" << instanceName;
        }

        ss << "\"";
      }
      ss << "]\n";
    }
  }

  if (meta.doc) {
    ss << pprint::Indent(indent) << "doc = " << to_string(meta.doc.value())
       << "\n";
  }

  if (meta.comment) {
    ss << pprint::Indent(indent)
       << "comment = " << to_string(meta.comment.value()) << "\n";
  }

  if (meta.customData) {
    ss << print_customData(meta.customData.value(), "customData", indent);
  }

  for (const auto &item : meta.unregisteredMetas) {
    // do not quote
    ss << pprint::Indent(indent) << item.first << " = " << item.second << "\n";
  }

  // TODO: deprecate meta.meta and remove it.
  for (const auto &item : meta.meta) {
    ss << print_meta(item.second, indent + 1, true, item.first);
  }

  // for (const auto &item : meta.stringData) {
  //   ss << pprint::Indent(indent) << to_string(item) << "\n";
  // }

  return ss.str();
}